

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_draw.cpp
# Opt level: O3

void __thiscall
Am_Drawonable_Impl::set_gc_using_fill
          (Am_Drawonable_Impl *this,Am_Style *fill,Am_Draw_Function f,Pixmap image)

{
  uint *puVar1;
  int iVar2;
  Am_Fill_Solid_Flag AVar3;
  Am_Wrapper *value;
  Am_Style_Data *pAVar4;
  unsigned_long fore_index;
  Am_Fill_Solid_Flag fill_flag;
  Am_Style_Data *this_00;
  ulong uVar5;
  Am_Image_Array fill_stipple;
  XGCValues values;
  Am_Image_Array AStack_c8;
  unsigned_long local_c0;
  Am_Style local_b8;
  XGCValues local_b0;
  
  local_c0 = 0;
  iVar2 = XGetGCValues(this->screen->display,this->screen->gc,Am_GC_getmask);
  if (iVar2 != 0) {
    value = Am_Style::operator_cast_to_Am_Wrapper_(fill);
    pAVar4 = Am_Style_Data::Narrow(value);
    if (pAVar4 == (Am_Style_Data *)0x0) {
      fore_index = this->screen->whitepixel;
    }
    else {
      this_00 = pAVar4;
      if (f == Am_DRAW_MASK_COPY) {
        this_00 = &Am_On_Bits_Data;
      }
      fore_index = Am_Style_Data::Get_X_Index(this_00,this);
      puVar1 = &(pAVar4->super_Am_Wrapper).refs;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        (*(pAVar4->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])(pAVar4);
      }
      if (image == 0) {
        Am_Image_Array::Am_Image_Array(&AStack_c8);
        AVar3 = Am_Style::Get_Fill_Flag(fill);
        fill_flag = Am_FILL_SOLID;
        if (AVar3 != Am_FILL_OPAQUE_STIPPLED || f != Am_DRAW_MASK_COPY) {
          Am_Style::Get_Stipple(&local_b8);
          Am_Image_Array::operator=(&AStack_c8,(Am_Image_Array *)&local_b8);
          Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&local_b8);
          fill_flag = AVar3;
        }
        adjust_gcvalues_stipple(this,&local_b0,&local_c0,fill_flag,&AStack_c8);
        Am_Image_Array::~Am_Image_Array(&AStack_c8);
        uVar5 = local_c0 | 0x200;
      }
      else {
        local_b0.fill_style = 2;
        uVar5 = 0xb00;
        local_b0.stipple = image;
      }
      local_b0.fill_rule = Am_Style::Get_Fill_Poly_Flag(fill);
      local_c0 = uVar5;
    }
    adjust_gcvalues_color_drawfn(this,&local_b0,&local_c0,fore_index,f);
    if (local_c0 != 0) {
      XChangeGC(this->screen->display,this->screen->gc,local_c0,&local_b0);
    }
    return;
  }
  Am_Error("** set_gc_using_fill: could not get GC values.\n");
}

Assistant:

void
Am_Drawonable_Impl::set_gc_using_fill(const Am_Style &fill, Am_Draw_Function f,
                                      Pixmap image) const
{
  XGCValues values;
  unsigned long mask = 0;

  Am_Fill_Solid_Flag fill_flag;
  unsigned long fore_index;

  if (XGetGCValues(screen->display, screen->gc, Am_GC_getmask, &values) == 0)
    Am_Error("** set_gc_using_fill: could not get GC values.\n");

  Am_Style_Data *fil = Am_Style_Data::Narrow(fill);
  if (fil) {
    if (f != Am_DRAW_MASK_COPY)
      fore_index = fil->Get_X_Index(this);
    else
      fore_index = Am_On_Bits_Data.Get_X_Index(this);
    fil->Release();

    // If there is an image, use it for the stipple.  Else, use the
    // image stored in the style.
    if (image) {
      values.stipple = image;
      values.fill_style = FillStippled;
      mask |= GCStipple | GCFillStyle;
    } else {
      Am_Image_Array fill_stipple;
      fill_flag = fill.Get_Fill_Flag();
      if ((fill_flag == Am_FILL_OPAQUE_STIPPLED) && (f == Am_DRAW_MASK_COPY))
        fill_flag = Am_FILL_SOLID;
      else
        fill_stipple = fill.Get_Stipple();
      adjust_gcvalues_stipple(values, mask, fill_flag, fill_stipple);
    }

    Am_Fill_Poly_Flag poly = fill.Get_Fill_Poly_Flag();
    set_gcvalues_fill_poly_rule(values, mask, poly);
  } else {
    fore_index = screen->whitepixel;
  }

  adjust_gcvalues_color_drawfn(values, mask, fore_index, f);
  if (mask) {
    XChangeGC(screen->display, screen->gc, mask, &values);
  }
}